

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O2

record * push_front(cache *Cache,char *label)

{
  int iVar1;
  record *prVar2;
  undefined1 auVar3 [16];
  hashnode *phVar4;
  ulong uVar5;
  record *record;
  uint uVar6;
  long lVar7;
  _Bool is_find;
  
  is_find = false;
  if (Cache->max_length - 1 <= Cache->length) {
    pop_back(Cache);
  }
  while (Cache->max_size < Cache->used_size + 0x400) {
    pop_back(Cache);
  }
  phVar4 = set_hashnode(&Cache->label_hash,label,(void *)0x0,&is_find);
  if (is_find == true) {
    record = (record *)phVar4->record;
    uVar5 = (long)record - (long)Cache->records;
    if ((long)uVar5 < 1) {
      uVar6 = 0xffffffff;
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar5;
      uVar6 = 0xffffffff;
      if (SUB168(auVar3 / ZEXT816(0x18),0) <= Cache->max_length) {
        uVar6 = SUB164(auVar3 / ZEXT816(0x18),0);
      }
    }
    if (uVar6 == Cache->first) {
      return record;
    }
    linklist_remove_node(Cache,record);
    uVar5 = Cache->length;
LAB_00101fae:
    if (uVar5 < 2) {
      record->next = -1;
      record->last = 0;
      Cache->records->next = uVar6;
      Cache->last = uVar6;
    }
    else {
      iVar1 = Cache->first;
      record->next = iVar1;
      record->last = 0;
      prVar2 = Cache->records;
      prVar2[iVar1].last = uVar6;
      prVar2->next = uVar6;
    }
    Cache->first = uVar6;
    return record;
  }
  iVar1 = Cache->stack_top;
  if (0 < (long)iVar1) {
    Cache->stack_top = iVar1 + -1;
    uVar6 = Cache->stack[iVar1];
    lVar7 = (long)(int)uVar6;
    if (-1 < lVar7) {
      prVar2 = Cache->records;
      record = prVar2 + lVar7;
      phVar4->record = record;
      prVar2[lVar7].valid = true;
      prVar2[lVar7].size = 0;
      uVar5 = Cache->length + 1;
      Cache->length = uVar5;
      goto LAB_00101fae;
    }
  }
  printf("no remain space");
  exit(1);
}

Assistant:

static inline struct record* push_front(cache*Cache,const char *label) {
  //向头插入
  bool is_find=false;
  hashnode *node;
  struct record *operate_record;
  // struct record_data* operate_record_data;
  int operate_record_addr;
  // time_t now = time(NULL);
  
  // if (now >= ttl){
  //   return -1;
  // }
  if (is_full(Cache)) {
    pop_back(Cache);
    #ifdef LOG_INCLUDED
    log_debug("pop back done\n");
    #endif
  }

  while (Cache->used_size + 1024 > Cache->max_size) {//预分配1kB内存，可能会超出范围
    pop_back(Cache);
    #ifdef LOG_INCLUDED
    log_debug("pop back done\n");
    #endif
  }
  node = set_hashnode(&Cache->label_hash,(void*)label,NULL,&is_find);//暂时用NULL占位

  if (is_find) { //找到了,但是也需要把它拉到最前面去
    operate_record = node->record;
    operate_record_addr = get_record_addr(Cache,operate_record);
    // operate_record_data = &operate_record->data;
    // //找到最后一个元素，并分配一个空间
    // while(operate_record_data->next){
    //   operate_record_data = operate_record_data->next;
    // }
    // operate_record_data =  operate_record_data->next = (struct record_data*)malloc(sizeof(struct record_data));
    
    //如果本来就是第一个，后面就不需要做了
    if (operate_record_addr == Cache->first) {
      // memcpy(&operate_record_data->ip, ip, sizeof(struct IP));
      return operate_record;
    }
    //否则就要把节点先切出来
    linklist_remove_node(Cache, operate_record);
  } else {
    //需要新分配一个空间
    if ((operate_record_addr = cache_stack_pop(Cache)) < 0) {
      printf("no remain space");
      exit(EXIT_FAILURE);
    }
    node->record = &Cache->records[operate_record_addr];
    operate_record = &Cache->records[operate_record_addr];
    // operate_record_data = &operate_record->data;
    operate_record_addr = operate_record_addr;
    // strcpy_s(operate_record->label,sizeof(operate_record->label),label);
    operate_record->valid = 1;
    operate_record->size = 0;
    Cache->length++;
    // Cache->used_size += record_size;
  }
  // memcpy(&operate_record->data.ip, ip, sizeof(struct IP));
  // operate_record->data.next=NULL;
  // operate_record->data.ttl = ttl;
  // operate_record->record_data_length++;

  if (Cache->length > 1) {
    operate_record->next = Cache->first;
    operate_record->last = LRU_BUFFER_HEAD_POINT;
    Cache->first = Cache->records[LRU_BUFFER_HEAD_POINT].next =
        Cache->records[Cache->first].last = operate_record_addr;
  } else {
    //只有新插入节点一个节点
    operate_record->next = -1;
    operate_record->last = LRU_BUFFER_HEAD_POINT;
    Cache->first = Cache->last = Cache->records[LRU_BUFFER_HEAD_POINT].next =
        operate_record_addr;
  }
  return operate_record;
}